

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

int lbinary(lua_State *L)

{
  char *pcVar1;
  undefined1 local_2030 [8];
  luaL_Buffer b;
  lua_State *L_local;
  
  b.initb._8184_8_ = L;
  lua_settop(L,1);
  luaL_buffinit((lua_State *)b.initb._8184_8_,(luaL_Buffer *)local_2030);
  if (b.b <= b.size) {
    luaL_prepbuffsize((luaL_Buffer *)local_2030,1);
  }
  pcVar1 = (char *)(b.size + 1);
  *(char *)((long)local_2030 + b.size) = '\0';
  b.size = (size_t)pcVar1;
  if (b.b <= pcVar1) {
    luaL_prepbuffsize((luaL_Buffer *)local_2030,1);
  }
  pcVar1 = (char *)(b.size + 1);
  *(char *)((long)local_2030 + b.size) = '\x05';
  b.size = (size_t)pcVar1;
  if (b.b <= pcVar1) {
    luaL_prepbuffsize((luaL_Buffer *)local_2030,1);
  }
  *(char *)((long)local_2030 + b.size) = '\0';
  b.size = b.size + 1;
  luaL_addvalue((luaL_Buffer *)local_2030);
  luaL_pushresult((luaL_Buffer *)local_2030);
  return 1;
}

Assistant:

static int
lbinary(lua_State *L) {
	lua_settop(L,1);
	luaL_Buffer b;
	luaL_buffinit(L, &b);
	luaL_addchar(&b, 0);
	luaL_addchar(&b, BSON_BINARY);
	luaL_addchar(&b, 0);	// sub type
	luaL_addvalue(&b);
	luaL_pushresult(&b);

	return 1;
}